

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

void Extra_ThreshPrintWeights(int T,int *pW,int nVars)

{
  int local_20;
  int i;
  int nVars_local;
  int *pW_local;
  int T_local;
  
  if (T == 0) {
    fprintf(_stdout,"\nHeuristic method: is not TLF\n\n");
  }
  else {
    fprintf(_stdout,"\nHeuristic method: Weights and threshold value:\n");
    for (local_20 = 0; local_20 < nVars; local_20 = local_20 + 1) {
      printf("%d ",(ulong)(uint)pW[local_20]);
    }
    printf("  %d\n",(ulong)(uint)T);
  }
  return;
}

Assistant:

void Extra_ThreshPrintWeights(int T, int * pW, int nVars) {
    int i;

    if (T == 0)
        fprintf( stdout, "\nHeuristic method: is not TLF\n\n");
    else {
        fprintf( stdout, "\nHeuristic method: Weights and threshold value:\n");
        for (i = 0; i < nVars; i++)
            printf("%d ", pW[i]);
        printf("  %d\n", T);
    }
}